

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config_cmd.c
# Opt level: O0

void clear_elements(void)

{
  if (db != (cfg_db *)0x0) {
    cfg_db_remove(db);
  }
  db = (cfg_db *)cfg_db_add();
  log_buf._len = 0;
  log_buf._error = false;
  memset(log_buf._buf,0,log_buf._total);
  return;
}

Assistant:

static void
clear_elements(void) {
  if (db) {
    cfg_db_remove(db);
  }
  db = cfg_db_add();
  abuf_clear(&log_buf);
}